

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

pair<glm::vec<2,_int,_(glm::qualifier)0>,_float>
vera::FindCandidate(Image *_image,ivec2 p0,ivec2 p1,ivec2 p2)

{
  bool bVar1;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar2;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar13;
  int iVar14;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar23;
  int iVar24;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar25;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar26;
  int iVar27;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar28;
  ulong uVar29;
  float fVar30;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar31;
  pair<glm::vec<2,_int,_(glm::qualifier)0>,_float> pVar32;
  float local_e0;
  ulong local_b8;
  
  aVar13 = p2.field_1;
  aVar28 = p1.field_0;
  aVar19 = p0.field_0;
  aVar25.x = aVar19.x;
  if (aVar28.x < aVar19.x) {
    aVar25.x = aVar28.x;
  }
  aVar26 = p1.field_1;
  aVar23 = p0.field_1;
  aVar2.y = aVar23.y;
  if (aVar26.y < aVar23.y) {
    aVar2.y = aVar26.y;
  }
  aVar15 = p2.field_0;
  if (aVar15.x < aVar25.x) {
    aVar25.x = aVar15.x;
  }
  if (aVar13.y < aVar2.y) {
    aVar2.y = aVar13.y;
  }
  aVar3.x = aVar28.x;
  if (aVar19.x - aVar28.x != 0 && aVar28.x <= aVar19.x) {
    aVar3.x = aVar19.x;
  }
  aVar8.y = aVar26.y;
  if (aVar23.y - aVar26.y != 0 && aVar26.y <= aVar23.y) {
    aVar8.y = aVar23.y;
  }
  iVar24 = -(aVar23.y - aVar26.y);
  if (aVar3.x <= aVar15.x) {
    aVar3.x = aVar15.x;
  }
  if (aVar8.y <= aVar13.y) {
    aVar8.y = aVar13.y;
  }
  iVar22 = (aVar25.x - aVar28.x) * (aVar13.y - aVar2.y) +
           (aVar15.x - aVar25.x) * (aVar26.y - aVar2.y);
  iVar11 = (aVar25.x - aVar15.x) * (aVar23.y - aVar2.y) +
           (aVar19.x - aVar25.x) * (aVar13.y - aVar2.y);
  iVar12 = aVar23.y - aVar13.y;
  fVar30 = (float)((aVar26.y - aVar13.y) * (aVar15.x - aVar19.x) + iVar12 * (aVar28.x - aVar15.x));
  iVar9 = (aVar25.x - aVar19.x) * (aVar26.y - aVar2.y) +
          (aVar28.x - aVar25.x) * (aVar23.y - aVar2.y);
  iVar4 = aVar13.y - aVar26.y;
  iVar5 = (*_image->_vptr_Image[0xe])(_image);
  (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var,iVar5));
  lVar20 = (long)aVar28.x;
  uVar29 = (long)p1 >> 0x20;
  iVar5 = (*_image->_vptr_Image[0xe])(_image,lVar20,uVar29);
  (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_00,iVar5));
  lVar21 = (long)aVar15.x;
  uVar18 = (long)p2 >> 0x20;
  iVar5 = (*_image->_vptr_Image[0xe])(_image,lVar21,uVar18);
  (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_01,iVar5));
  if (lVar21 < lVar20) {
    lVar20 = lVar21;
  }
  if (aVar19.x <= lVar20) {
    lVar20 = (long)aVar19.x;
  }
  if ((long)p0 >> 0x20 < (long)uVar29) {
    uVar29 = (long)p0 >> 0x20;
  }
  if ((long)uVar18 <= (long)uVar29) {
    uVar29 = uVar18;
  }
  iVar5 = (int)uVar29;
  local_e0 = 0.0;
  local_b8 = 0;
  uVar10 = 0;
  do {
    uVar16 = 0;
    if ((iVar22 < 0 && (ulong)p2 >> 0x20 != (ulong)p1 >> 0x20) &&
       (uVar16 = -(iVar22 / iVar4), -1 < iVar22 / iVar4)) {
      uVar16 = 0;
    }
    uVar6 = uVar16;
    if ((iVar11 < 0 && (ulong)p0 >> 0x20 != (ulong)p2 >> 0x20) &&
       (uVar6 = -(iVar11 / iVar12),
       uVar16 != uVar6 && SBORROW4(uVar16,uVar6) == (int)(uVar16 + iVar11 / iVar12) < 0)) {
      uVar6 = uVar16;
    }
    uVar16 = uVar6;
    if ((iVar9 < 0 && (ulong)p1 >> 0x20 != (ulong)p0 >> 0x20) &&
       (uVar16 = -(iVar9 / iVar24),
       uVar6 != uVar16 && SBORROW4(uVar6,uVar16) == (int)(uVar6 + iVar9 / iVar24) < 0)) {
      uVar16 = uVar6;
    }
    if ((int)(aVar25.x + uVar16) <= aVar3.x) {
      iVar27 = uVar16 * iVar24 + iVar9;
      iVar14 = uVar16 * iVar12 + iVar11;
      uVar18 = (ulong)uVar16;
      iVar17 = uVar16 * iVar4 + iVar22;
      bVar1 = false;
      do {
        if (((iVar17 < 0) || (iVar14 < 0)) || (iVar27 < 0)) {
          if (bVar1) break;
        }
        else {
          iVar7 = (*_image->_vptr_Image[0xe])(_image,lVar20 + uVar18,uVar29);
          (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_02,iVar7));
          fVar31 = ABS(((float)iVar27 * (extraout_XMM0_Da_01 / fVar30) +
                       (float)iVar14 * (extraout_XMM0_Da_00 / fVar30) +
                       (float)iVar17 * (extraout_XMM0_Da / fVar30)) - extraout_XMM0_Da_02);
          bVar1 = true;
          if (local_e0 < fVar31) {
            uVar10 = (int)lVar20 + (int)uVar18;
            local_b8 = uVar29 & 0xffffffff;
            local_e0 = fVar31;
          }
        }
        iVar17 = iVar17 + iVar4;
        iVar14 = iVar14 + iVar12;
        iVar27 = iVar27 + iVar24;
        uVar18 = uVar18 + 1;
      } while ((aVar3.x - aVar25.x) + 1 != (int)uVar18);
    }
    iVar22 = iVar22 + (aVar28.x - aVar15.x);
    iVar11 = iVar11 + (aVar15.x - aVar19.x);
    iVar9 = iVar9 + (aVar19.x - aVar28.x);
    uVar29 = uVar29 + 1;
    if (((aVar8.y + iVar5) - aVar2.y) + 1 == (int)uVar29) {
      iVar24 = (int)local_b8;
      if ((((uVar10 == aVar19.x) && (iVar24 == aVar23.y)) ||
          ((uVar10 == aVar28.x && (iVar24 == aVar26.y)))) ||
         ((uVar10 == aVar15.x && (iVar24 == aVar13.y)))) {
        local_e0 = 0.0;
      }
      pVar32.first = (vec<2,_int,_(glm::qualifier)0>)((ulong)uVar10 | local_b8 << 0x20);
      pVar32.second = local_e0;
      return pVar32;
    }
  } while( true );
}

Assistant:

std::pair<glm::ivec2, float> FindCandidate( const Image& _image, const glm::ivec2 p0, const glm::ivec2 p1, const glm::ivec2 p2) { 
    
    const auto edge = []( const glm::ivec2 a, const glm::ivec2 b, const glm::ivec2 c) {
        return (b.x - c.x) * (a.y - c.y) - (b.y - c.y) * (a.x - c.x);
    };

    // triangle bounding box
    const glm::ivec2 min = glm::min(glm::min(p0, p1), p2);
    const glm::ivec2 max = glm::max(glm::max(p0, p1), p2);

    // forward differencing variables
    int w00 = edge(p1, p2, min);
    int w01 = edge(p2, p0, min);
    int w02 = edge(p0, p1, min);
    const int a01 = p1.y - p0.y;
    const int b01 = p0.x - p1.x;
    const int a12 = p2.y - p1.y;
    const int b12 = p1.x - p2.x;
    const int a20 = p0.y - p2.y;
    const int b20 = p2.x - p0.x;

    // pre-multiplied z values at vertices
    const float a = edge(p0, p1, p2);
    const float z0 = _image.getValue( _image.getIndex(p0.x, p0.y) ) / a;
    const float z1 = _image.getValue( _image.getIndex(p1.x, p1.y) ) / a;
    const float z2 = _image.getValue( _image.getIndex(p2.x, p2.y) ) / a;

    // iterate over pixels in bounding box
    float maxError = 0;
    glm::ivec2 maxPoint(0);
    for (int y = min.y; y <= max.y; y++) {
        // compute starting offset
        int dx = 0;
        if (w00 < 0 && a12 != 0)
            dx = std::max(dx, -w00 / a12);
        if (w01 < 0 && a20 != 0)
            dx = std::max(dx, -w01 / a20);
        if (w02 < 0 && a01 != 0)
            dx = std::max(dx, -w02 / a01);

        int w0 = w00 + a12 * dx;
        int w1 = w01 + a20 * dx;
        int w2 = w02 + a01 * dx;

        bool wasInside = false;

        for (int x = min.x + dx; x <= max.x; x++) {
            // check if inside triangle
            if (w0 >= 0 && w1 >= 0 && w2 >= 0) {
                wasInside = true;

                // compute z using barycentric coordinates
                const float z = z0 * w0 + z1 * w1 + z2 * w2;
                const float dz = std::abs(z - _image.getValue( _image.getIndex(x, y) ) );
                if (dz > maxError) {
                    maxError = dz;
                    maxPoint = glm::ivec2(x, y);
                }
            } else if (wasInside) {
                break;
            }

            w0 += a12;
            w1 += a20;
            w2 += a01;
        }

        w00 += b12;
        w01 += b20;
        w02 += b01;
    }

    if (maxPoint == p0 || maxPoint == p1 || maxPoint == p2) {
        maxError = 0;
    }

    return std::make_pair(maxPoint, maxError);
}